

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::FilenameToClassname
                   (string *__return_storage_ptr__,string *filename)

{
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  
  std::__cxx11::string::find_last_of((char *)filename,0x35b5d3,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
  uVar1 = __return_storage_ptr__->_M_string_length;
  if (uVar1 != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    uVar3 = 0;
    do {
      if (pcVar2[uVar3] == '/') {
        pcVar2[uVar3] = '\\';
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        uVar1 = __return_storage_ptr__->_M_string_length;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FilenameToClassname(const string& filename) {
  int lastindex = filename.find_last_of(".");
  std::string result = filename.substr(0, lastindex);
  for (int i = 0; i < result.size(); i++) {
    if (result[i] == '/') {
      result[i] = '\\';
    }
  }
  return result;
}